

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimemagicrule.cpp
# Opt level: O0

bool __thiscall QMimeMagicRule::operator==(QMimeMagicRule *this,QMimeMagicRule *other)

{
  bool bVar1;
  QByteArray *in_RSI;
  long in_RDI;
  uint7 in_stack_ffffffffffffffe8;
  bool bVar2;
  
  bVar2 = false;
  if (*(int *)(in_RDI + 0x18) == *(int *)&in_RSI[1].d.d) {
    bVar1 = ::operator==(in_RSI,(QByteArray *)(ulong)in_stack_ffffffffffffffe8);
    bVar2 = false;
    if (((bVar1) && (bVar2 = false, *(int *)(in_RDI + 0x38) == *(int *)&in_RSI[2].d.ptr)) &&
       (bVar2 = false, *(int *)(in_RDI + 0x3c) == *(int *)((long)&in_RSI[2].d.ptr + 4))) {
      bVar1 = ::operator==(in_RSI,(QByteArray *)(ulong)in_stack_ffffffffffffffe8);
      bVar2 = false;
      if (bVar1) {
        bVar1 = ::operator==(in_RSI,(QByteArray *)(ulong)in_stack_ffffffffffffffe8);
        bVar2 = false;
        if (((bVar1) && (bVar2 = false, *(int *)(in_RDI + 0x70) == (int)in_RSI[4].d.size)) &&
           (bVar2 = false, *(int *)(in_RDI + 0x74) == *(int *)((long)&in_RSI[4].d.size + 4))) {
          bVar2 = *(Data **)(in_RDI + 0x78) == in_RSI[5].d.d &&
                  (*(Data **)(in_RDI + 0x78) == (Data *)0x0 ||
                  *(char **)(in_RDI + 0x80) == in_RSI[5].d.ptr);
        }
      }
    }
  }
  return bVar2;
}

Assistant:

bool QMimeMagicRule::operator==(const QMimeMagicRule &other) const
{
    return m_type == other.m_type &&
           m_value == other.m_value &&
           m_startPos == other.m_startPos &&
           m_endPos == other.m_endPos &&
           m_mask == other.m_mask &&
           m_pattern == other.m_pattern &&
           m_number == other.m_number &&
           m_numberMask == other.m_numberMask &&
           m_matchFunction == other.m_matchFunction;
}